

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O1

void __thiscall
EnvironmentROBARM::Create2DStateSpace(EnvironmentROBARM *this,State2D ***statespace2D)

{
  undefined1 auVar1 [16];
  long lVar2;
  State2D **ppSVar3;
  ulong uVar4;
  State2D *pSVar5;
  ulong uVar6;
  
  lVar2 = (long)(this->EnvROBARMCfg).EnvWidth_c;
  uVar6 = lVar2 * 8;
  if (lVar2 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  ppSVar3 = (State2D **)operator_new__(uVar6);
  *statespace2D = ppSVar3;
  if (0 < (this->EnvROBARMCfg).EnvWidth_c) {
    uVar6 = 0;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(this->EnvROBARMCfg).EnvHeight_c;
      uVar4 = SUB168(auVar1 * ZEXT816(0xc),0);
      if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      pSVar5 = (State2D *)operator_new__(uVar4);
      (*statespace2D)[uVar6] = pSVar5;
      if (0 < (this->EnvROBARMCfg).EnvWidth_c) {
        lVar2 = 0;
        uVar4 = 0;
        do {
          (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x22])
                    (this,(long)&(*statespace2D)[uVar6]->g + lVar2,uVar6 & 0xffff,uVar4 & 0xffff);
          uVar4 = uVar4 + 1;
          lVar2 = lVar2 + 0xc;
        } while ((long)uVar4 < (long)(this->EnvROBARMCfg).EnvWidth_c);
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)(this->EnvROBARMCfg).EnvWidth_c);
  }
  return;
}

Assistant:

void EnvironmentROBARM::Create2DStateSpace(State2D*** statespace2D)
{
    int x, y;

    //allocate a statespace for 2D search
    *statespace2D = new State2D*[EnvROBARMCfg.EnvWidth_c];
    for (x = 0; x < EnvROBARMCfg.EnvWidth_c; x++) {
        (*statespace2D)[x] = new State2D[EnvROBARMCfg.EnvHeight_c];
        for (y = 0; y < EnvROBARMCfg.EnvWidth_c; y++) {
            InitializeState2D(&(*statespace2D)[x][y], x, y);
        }
    }
}